

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gm107.c
# Opt level: O0

void gm107_prep(disisa *isa)

{
  int iVar1;
  int f;
  int f_00;
  int iVar2;
  int v;
  int v_00;
  vardata *pvVar3;
  int v_sm60;
  int v_sm52;
  int v_sm50;
  int vs_sm;
  int f_sm60op;
  int f_sm52op;
  int f_sm50op;
  disisa *isa_local;
  
  pvVar3 = vardata_new("sm50isa");
  isa->vardata = pvVar3;
  iVar1 = vardata_add_feature(isa->vardata,"sm50op","SM50 exclusive opcodes");
  f = vardata_add_feature(isa->vardata,"sm52op","SM52+ opcodes");
  f_00 = vardata_add_feature(isa->vardata,"sm60op","SM60 exclusive opcodes");
  if (((iVar1 == -1) || (f == -1)) || (f_00 == -1)) {
    abort();
  }
  iVar2 = vardata_add_varset(isa->vardata,"sm","SM version");
  if (iVar2 == -1) {
    abort();
  }
  v = vardata_add_variant(isa->vardata,"sm50","SM50:SM60",iVar2);
  v_00 = vardata_add_variant(isa->vardata,"sm52","SM52+",iVar2);
  iVar2 = vardata_add_variant(isa->vardata,"sm60","SM60+",iVar2);
  if (((v != -1) && (v_00 != -1)) && (iVar2 != -1)) {
    vardata_variant_feature(isa->vardata,v,iVar1);
    vardata_variant_feature(isa->vardata,v_00,iVar1);
    vardata_variant_feature(isa->vardata,v_00,f);
    vardata_variant_feature(isa->vardata,iVar2,f);
    vardata_variant_feature(isa->vardata,iVar2,f_00);
    iVar1 = vardata_validate(isa->vardata);
    if (iVar1 != 0) {
      abort();
    }
    return;
  }
  abort();
}

Assistant:

static void gm107_prep(struct disisa *isa) {
	isa->vardata = vardata_new("sm50isa");
	int f_sm50op = vardata_add_feature(isa->vardata, "sm50op", "SM50 exclusive opcodes");
	int f_sm52op = vardata_add_feature(isa->vardata, "sm52op", "SM52+ opcodes");
	int f_sm60op = vardata_add_feature(isa->vardata, "sm60op", "SM60 exclusive opcodes");
	if (f_sm50op == -1 || f_sm52op == -1 || f_sm60op == -1)
		abort();
	int vs_sm = vardata_add_varset(isa->vardata, "sm", "SM version");
	if (vs_sm == -1)
		abort();
	int v_sm50 = vardata_add_variant(isa->vardata, "sm50", "SM50:SM60", vs_sm);
	int v_sm52 = vardata_add_variant(isa->vardata, "sm52", "SM52+", vs_sm);
	int v_sm60 = vardata_add_variant(isa->vardata, "sm60", "SM60+", vs_sm);
	if (v_sm50 == -1 || v_sm52 == -1 || v_sm60 == -1)
		abort();
	vardata_variant_feature(isa->vardata, v_sm50, f_sm50op);
	vardata_variant_feature(isa->vardata, v_sm52, f_sm50op);
	vardata_variant_feature(isa->vardata, v_sm52, f_sm52op);
	vardata_variant_feature(isa->vardata, v_sm60, f_sm52op);
	vardata_variant_feature(isa->vardata, v_sm60, f_sm60op);
	if (vardata_validate(isa->vardata))
		abort();
}